

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 MemObjBooleanValue(jx9_value *pObj)

{
  uint uVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  char *pcVar4;
  bool bVar5;
  sxu32 n;
  jx9_hashmap *pMap;
  char *zEnd;
  char *zIn;
  SyString sString;
  sxi32 iFlags;
  jx9_value *pObj_local;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 2) == 0) {
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 0x20) == 0) {
          if ((uVar1 & 0x40) == 0) {
            if ((uVar1 & 0x100) == 0) {
              pObj_local._4_4_ = 0;
            }
            else {
              pObj_local._4_4_ = (uint)((pObj->x).iVal != 0);
            }
          }
          else {
            sVar2 = ((jx9_hashmap *)(pObj->x).pOther)->nEntry;
            jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
            pObj_local._4_4_ = (uint)(sVar2 != 0);
          }
        }
        else {
          pObj_local._4_4_ = 0;
        }
      }
      else {
        zEnd = (char *)(pObj->sBlob).pBlob;
        uVar1 = (pObj->sBlob).nByte;
        if (uVar1 == 0) {
          pObj_local._4_4_ = 0;
        }
        else if ((((uVar1 == 4) && (sVar3 = SyStrnicmp(zEnd,"true",4), sVar3 == 0)) ||
                 ((uVar1 == 2 && (sVar3 = SyStrnicmp(zEnd,"on",2), sVar3 == 0)))) ||
                ((uVar1 == 3 && (sVar3 = SyStrnicmp(zEnd,"yes",3), sVar3 == 0)))) {
          pObj_local._4_4_ = 1;
        }
        else if ((uVar1 == 5) && (sVar3 = SyStrnicmp(zEnd,"false",5), sVar3 == 0)) {
          pObj_local._4_4_ = 0;
        }
        else {
          pcVar4 = zEnd + uVar1;
          while( true ) {
            bVar5 = false;
            if (zEnd < pcVar4) {
              bVar5 = *zEnd == '0';
            }
            if (!bVar5) break;
            zEnd = zEnd + 1;
          }
          pObj_local._4_4_ = (uint)(zEnd < pcVar4);
        }
      }
    }
    else {
      pObj_local._4_4_ = (uint)((pObj->x).iVal != 0);
    }
  }
  else {
    pObj_local._4_4_ = (uint)((pObj->x).rVal != 0.0);
  }
  return pObj_local._4_4_;
}

Assistant:

static sxi32 MemObjBooleanValue(jx9_value *pObj)
{
	sxi32 iFlags;	
	iFlags = pObj->iFlags;
	if (iFlags & MEMOBJ_REAL ){
#ifdef JX9_OMIT_FLOATING_POINT
		return pObj->x.rVal ? 1 : 0;
#else
		return pObj->x.rVal != 0.0 ? 1 : 0;
#endif
	}else if( iFlags & MEMOBJ_INT ){
		return pObj->x.iVal ? 1 : 0;
	}else if (iFlags & MEMOBJ_STRING) {
		SyString sString;
		SyStringInitFromBuf(&sString, SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob));
		if( sString.nByte == 0 ){
			/* Empty string */
			return 0;
		}else if( (sString.nByte == sizeof("true") - 1 && SyStrnicmp(sString.zString, "true", sizeof("true")-1) == 0) ||
			(sString.nByte == sizeof("on") - 1 && SyStrnicmp(sString.zString, "on", sizeof("on")-1) == 0) ||
			(sString.nByte == sizeof("yes") - 1 && SyStrnicmp(sString.zString, "yes", sizeof("yes")-1) == 0) ){
				return 1;
		}else if( sString.nByte == sizeof("false") - 1 && SyStrnicmp(sString.zString, "false", sizeof("false")-1) == 0 ){
			return 0;
		}else{
			const char *zIn, *zEnd;
			zIn = sString.zString;
			zEnd = &zIn[sString.nByte];
			while( zIn < zEnd && zIn[0] == '0' ){
				zIn++;
			}
			return zIn >= zEnd ? 0 : 1;
		}
	}else if( iFlags & MEMOBJ_NULL ){
		return 0;
	}else if( iFlags & MEMOBJ_HASHMAP ){
		jx9_hashmap *pMap = (jx9_hashmap *)pObj->x.pOther;
		sxu32 n = pMap->nEntry;
		jx9HashmapUnref(pMap);
		return n > 0 ? TRUE : FALSE;
	}else if(iFlags & MEMOBJ_RES ){
		return pObj->x.pOther != 0;
	}
	/* NOT REACHED */
	return 0;
}